

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O2

void Ivy_ManStopFanout(Ivy_Man_t *p)

{
  void *pvVar1;
  int i;
  
  if (p->fFanout != 0) {
    p->fFanout = 0;
    for (i = 0; i < p->vObjs->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(p->vObjs,i);
      if (pvVar1 != (void *)0x0) {
        *(undefined8 *)((long)pvVar1 + 0x30) = 0;
        *(undefined8 *)((long)pvVar1 + 0x38) = 0;
        *(undefined8 *)((long)pvVar1 + 0x20) = 0;
        *(undefined8 *)((long)pvVar1 + 0x28) = 0;
        *(undefined8 *)((long)pvVar1 + 0x40) = 0;
      }
    }
    return;
  }
  __assert_fail("p->fFanout",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                ,0xa6,"void Ivy_ManStopFanout(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManStopFanout( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( p->fFanout );
    p->fFanout = 0;
    Ivy_ManForEachObj( p, pObj, i )
        pObj->pFanout = pObj->pNextFan0 = pObj->pNextFan1 = pObj->pPrevFan0 = pObj->pPrevFan1 = NULL;
}